

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void YM2608IRQFlagWrite(FM_OPN *OPN,YM2608 *F2608,int v)

{
  byte bVar1;
  
  if (-1 < (char)(byte)v) {
    bVar1 = ~(byte)v | 0xe0;
    F2608->flagmask = bVar1;
    FM_IRQMASK_SET(&OPN->ST,(uint)(bVar1 & F2608->irqmask));
    return;
  }
  FM_STATUS_RESET(&OPN->ST,0xf7);
  return;
}

Assistant:

INLINE void YM2608IRQFlagWrite(FM_OPN *OPN, YM2608 *F2608, int v)
{
	if( v & 0x80 )
	{   /* Reset IRQ flag */
		FM_STATUS_RESET(&OPN->ST, 0xf7); /* don't touch BUFRDY flag otherwise we'd have to call ymdeltat module to set the flag back */
	}
	else
	{   /* Set status flag mask */
		F2608->flagmask = (~(v&0x1f));
		FM_IRQMASK_SET(&OPN->ST, (F2608->irqmask & F2608->flagmask) );
	}
}